

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

int __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cmpIgnoreCase_pcp
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *string)

{
  DstUnit *pDVar1;
  utf32_t uVar2;
  utf32_t uVar3;
  C *pCVar4;
  C *pCVar5;
  C *end;
  ulong uVar6;
  ulong uVar7;
  int unaff_EBP;
  C *p0;
  C *p0_00;
  C *pCVar8;
  ulong uVar9;
  bool bVar10;
  utf32_t buffer2 [64];
  utf32_t buffer1 [64];
  EncodingEmitter_s local_278;
  UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap> local_260;
  C *local_258;
  DstUnit *local_250;
  DstUnit *local_248;
  C *local_240;
  utf32_t local_238 [61];
  DstUnit aDStack_144 [3];
  utf32_t local_138 [61];
  DstUnit aDStack_44 [5];
  
  end = this->m_p + this->m_length;
  local_240 = string->m_p + string->m_length;
  local_250 = aDStack_44;
  local_248 = aDStack_144;
  p0 = string->m_p;
  p0_00 = this->m_p;
  do {
    pCVar5 = local_240;
    if ((end <= p0_00) || (local_240 <= p0)) {
      if (p0 < local_240) {
        return -1;
      }
      return (uint)(p0_00 < end);
    }
    local_278.super_EncodingEmitter_u.m_p = local_138;
    local_278.super_EncodingEmitter_u.m_replacement = 0xfffd;
    local_278.m_end = local_250;
    local_260.m_state = 0;
    local_260.m_cp = 0;
    pCVar4 = enc::Utf8Decoder::
             decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::EncodingEmitter_s>
                       ((Dfa *)&local_260,&local_278,p0_00,end);
    pDVar1 = local_278.super_EncodingEmitter_u.m_p;
    local_278.super_EncodingEmitter_u.m_p = local_238;
    local_278.super_EncodingEmitter_u.m_replacement = 0xfffd;
    local_278.m_end = local_248;
    local_260.m_state = 0;
    local_260.m_cp = 0;
    pCVar5 = enc::Utf8Decoder::
             decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::EncodingEmitter_s>
                       ((Dfa *)&local_260,&local_278,p0,pCVar5);
    uVar7 = (long)pDVar1 - (long)local_138 >> 2;
    uVar9 = (long)local_278.super_EncodingEmitter_u.m_p - (long)local_238 >> 2;
    if (uVar7 < uVar9) {
      uVar9 = uVar7;
    }
    bVar10 = uVar9 != 0;
    pCVar8 = pCVar4;
    if (bVar10) {
      local_258 = pCVar5;
      uVar2 = enc::toCaseFolded(local_138[0]);
      uVar3 = enc::toCaseFolded(local_238[0]);
      if (uVar3 < uVar2) {
        unaff_EBP = 1;
      }
      if (uVar2 < uVar3) {
        unaff_EBP = -1;
      }
      pCVar5 = p0;
      pCVar8 = p0_00;
      if (uVar2 == uVar3) {
        uVar7 = 1;
        do {
          uVar6 = uVar7;
          pCVar5 = local_258;
          pCVar8 = pCVar4;
          if (uVar9 == uVar6) break;
          uVar2 = enc::toCaseFolded(local_138[uVar6]);
          uVar3 = enc::toCaseFolded(local_238[uVar6]);
          if (uVar3 < uVar2) {
            unaff_EBP = 1;
          }
          if (uVar2 < uVar3) {
            unaff_EBP = -1;
          }
          pCVar5 = p0;
          uVar7 = uVar6 + 1;
          pCVar8 = p0_00;
        } while (uVar2 == uVar3);
        bVar10 = uVar6 < uVar9;
      }
    }
    p0 = pCVar5;
    p0_00 = pCVar8;
    if (bVar10) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

int
	cmpIgnoreCase_pcp(const StringRef& string) const {
		typedef enc::Convert<enc::Utf32, Encoding> Convert;
		typedef enc::ConvertResult<utf32_t, C> ConvertResult;

		const C* p1 = m_p;
		const C* end1 = p1 + m_length;
		const C* p2 = string.m_p;
		const C* end2 = p2 + string.m_length;

		while (p1 < end1 && p2 < end2) {
			utf32_t buffer1[64];
			utf32_t buffer2[64];

			ConvertResult result1 = Convert::convert(buffer1, buffer1 + countof(buffer1), p1, end1);
			ConvertResult result2 = Convert::convert(buffer2, buffer2 + countof(buffer2), p2, end2);

			size_t length1 = result1.m_dst - buffer1;
			size_t length2 = result2.m_dst - buffer2;
			size_t length = AXL_MIN(length1, length2);

			for (size_t i = 0; i < length; i++) {
				utf32_t c1 = enc::toCaseFolded(buffer1[i]);
				utf32_t c2 = enc::toCaseFolded(buffer2[i]);

				if (c1 < c2)
					return -1;
				else if (c1 > c2)
					return 1;
			}

			p1 = result1.m_src;
			p2 = result2.m_src;
		}

		return
			p2 < end2 ? -1 :
			p1 < end1 ? 1 : 0;
	}